

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_io.c
# Opt level: O1

IOFileUD * io_file_open(lua_State *L,char *mode)

{
  GCstr *pGVar1;
  IOFileUD *pIVar2;
  ulong uVar3;
  FILE *pFVar4;
  int *piVar5;
  char *pcVar6;
  
  pGVar1 = lj_lib_checkstr(L,1);
  pIVar2 = (IOFileUD *)lua_newuserdata(L,0x10);
  uVar3 = (ulong)L->top[-1].u32.lo;
  *(undefined1 *)(uVar3 + 6) = 1;
  *(undefined4 *)(uVar3 + 0x10) = *(undefined4 *)((ulong)L->base[-1].u32.lo + 8);
  pIVar2->fp = (FILE *)0x0;
  pIVar2->type = 0;
  pFVar4 = fopen64((char *)(pGVar1 + 1),mode);
  pIVar2->fp = (FILE *)pFVar4;
  if (pFVar4 == (FILE *)0x0) {
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    pcVar6 = lj_strfmt_pushf(L,"%s: %s",pGVar1 + 1,pcVar6);
    luaL_argerror(L,1,pcVar6);
  }
  return pIVar2;
}

Assistant:

static IOFileUD *io_file_open(lua_State *L, const char *mode)
{
  const char *fname = strdata(lj_lib_checkstr(L, 1));
  IOFileUD *iof = io_file_new(L);
  iof->fp = fopen(fname, mode);
  if (iof->fp == NULL)
    luaL_argerror(L, 1, lj_strfmt_pushf(L, "%s: %s", fname, strerror(errno)));
  return iof;
}